

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

ByteArray __thiscall asl::File::firstBytes(File *this,int n)

{
  int iVar1;
  size_t sVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  File *this_00;
  
  this_00 = (File *)CONCAT44(in_register_00000034,n);
  Array<unsigned_char>::alloc((Array<unsigned_char> *)this,in_EDX);
  if (this_00->_file == (FILE *)0x0) {
    iVar1 = open(this_00,(char *)&this_00->_path,0);
    if ((char)iVar1 == '\0') {
      iVar1 = 0;
      Array<unsigned_char>::reserve((Array<unsigned_char> *)this,0);
      goto LAB_00134710;
    }
  }
  sVar2 = fread(this->_file,1,(long)in_EDX,(FILE *)this_00->_file);
  iVar1 = (int)sVar2;
  Array<unsigned_char>::reserve((Array<unsigned_char> *)this,iVar1);
LAB_00134710:
  *(int *)(this->_file + -0x10) = iVar1;
  return (ByteArray)(uchar *)this;
}

Assistant:

ByteArray File::firstBytes(int n)
{
	ByteArray data(n);
	if (!_file && !open(_path)) {
		data.clear();
		return data;
	}
	data.resize(read(&data[0], n));
	return data;
}